

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * ot::commissioner::CommissionerImpl::EncodeCommissionerDataset
                  (Error *__return_storage_ptr__,Request *aRequest,CommissionerDataset *aDataset)

{
  string *this;
  ErrorCode EVar1;
  Tlv local_80;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  char local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  local_38 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_38;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if ((aDataset->mPresentFlags & 0x4000) != 0) {
    tlv::Tlv::Tlv(&local_80,kCommissionerSessionId,aDataset->mSessionId,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    __return_storage_ptr__->mCode = local_60._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_58);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
    if (local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar1 != kNone) {
      return __return_storage_ptr__;
    }
  }
  if ((short)aDataset->mPresentFlags < 0) {
    tlv::Tlv::Tlv(&local_80,kBorderAgentLocator,aDataset->mBorderAgentLocator,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    __return_storage_ptr__->mCode = local_60._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_58);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
    if (local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar1 != kNone) {
      return __return_storage_ptr__;
    }
  }
  if ((aDataset->mPresentFlags & 0x2000) != 0) {
    tlv::Tlv::Tlv(&local_80,kNetworkDiagIpv6Address,&aDataset->mSteeringData,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    __return_storage_ptr__->mCode = local_60._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_58);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
    if (local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar1 != kNone) {
      return __return_storage_ptr__;
    }
  }
  if ((aDataset->mPresentFlags & 0x1000) != 0) {
    tlv::Tlv::Tlv(&local_80,kAeSteeringData,&aDataset->mAeSteeringData,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    __return_storage_ptr__->mCode = local_60._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_58);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
    if (local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar1 != kNone) {
      return __return_storage_ptr__;
    }
  }
  if ((aDataset->mPresentFlags & 0x800) != 0) {
    tlv::Tlv::Tlv(&local_80,kNmkpSteeringData,&aDataset->mNmkpSteeringData,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    __return_storage_ptr__->mCode = local_60._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_58);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
    if (local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar1 != kNone) {
      return __return_storage_ptr__;
    }
  }
  if ((aDataset->mPresentFlags & 0x400) != 0) {
    tlv::Tlv::Tlv(&local_80,kJoinerUdpPort,aDataset->mJoinerUdpPort,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    __return_storage_ptr__->mCode = local_60._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_58);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
    if (local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar1 != kNone) {
      return __return_storage_ptr__;
    }
  }
  if ((aDataset->mPresentFlags & 0x200) != 0) {
    tlv::Tlv::Tlv(&local_80,kAeUdpPort,aDataset->mAeUdpPort,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    __return_storage_ptr__->mCode = local_60._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_58);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
    if (local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar1 != kNone) {
      return __return_storage_ptr__;
    }
  }
  if ((aDataset->mPresentFlags & 0x100) != 0) {
    tlv::Tlv::Tlv(&local_80,kNmkpUdpPort,aDataset->mNmkpUdpPort,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    __return_storage_ptr__->mCode = local_60._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_58);
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
    if (local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodeCommissionerDataset(coap::Request &aRequest, const CommissionerDataset &aDataset)
{
    Error error;

    if (aDataset.mPresentFlags & CommissionerDataset::kSessionIdBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kCommissionerSessionId, aDataset.mSessionId}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kBorderAgentLocatorBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kBorderAgentLocator, aDataset.mBorderAgentLocator}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kSteeringDataBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kSteeringData, aDataset.mSteeringData}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kAeSteeringDataBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kAeSteeringData, aDataset.mAeSteeringData}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kNmkpSteeringDataBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNmkpSteeringData, aDataset.mNmkpSteeringData}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kJoinerUdpPortBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kJoinerUdpPort, aDataset.mJoinerUdpPort}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kAeUdpPortBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kAeUdpPort, aDataset.mAeUdpPort}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kNmkpUdpPortBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNmkpUdpPort, aDataset.mNmkpUdpPort}));
    }

exit:
    return error;
}